

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Filter
          (Relation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expressions)

{
  BaseExpression *pBVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Relation *pRVar4;
  type context;
  reference pvVar5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer *__ptr;
  size_type __n;
  shared_ptr<duckdb::Relation,_true> sVar6;
  type expr;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expression_list;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_98;
  undefined1 local_89;
  shared_ptr<duckdb::FilterRelation,_true> local_88;
  undefined1 local_78 [24];
  long local_60;
  Relation *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_48;
  enable_shared_from_this<duckdb::Relation> local_40;
  
  local_50 = this;
  local_48 = expressions;
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(expressions + 1));
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_78);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)local_78);
  StringListToExpressionList
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)(local_78 + 0x10),context,in_RDX);
  if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                         *)(local_78 + 0x10),0);
  local_98._M_head_impl =
       (pvVar5->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pvVar5->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  if (8 < (ulong)(local_60 - local_78._16_8_)) {
    __n = 1;
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                             *)(local_78 + 0x10),__n);
      this_00._M_head_impl = (ParsedExpression *)operator_new(0x50);
      local_78._0_8_ = local_98._M_head_impl;
      local_98._M_head_impl = (ParsedExpression *)0x0;
      local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (pvVar5->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pvVar5->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)0x0;
      ConjunctionExpression::ConjunctionExpression
                ((ConjunctionExpression *)this_00._M_head_impl,CONJUNCTION_AND,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_78,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_88);
      if (local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        (**(code **)((long)((local_88.internal.
                             super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_Relation)._vptr_Relation + 8))();
      }
      local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_78._0_8_ !=
          (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
        (*((BaseExpression *)local_78._0_8_)->_vptr_BaseExpression[1])();
      }
      if (local_98._M_head_impl != (ParsedExpression *)0x0) {
        pBVar1 = &(local_98._M_head_impl)->super_BaseExpression;
        local_98._M_head_impl = this_00._M_head_impl;
        (*pBVar1->_vptr_BaseExpression[1])();
        this_00._M_head_impl = local_98._M_head_impl;
      }
      local_98._M_head_impl = this_00._M_head_impl;
      __n = __n + 1;
    } while (__n < (ulong)(local_60 - local_78._16_8_ >> 3));
  }
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_40);
  local_78._0_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::FilterRelation,std::allocator<duckdb::FilterRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
             (FilterRelation **)local_78,(allocator<duckdb::FilterRelation> *)&local_89,
             (shared_ptr<duckdb::Relation,_true> *)&local_40,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_98);
  shared_ptr<duckdb::FilterRelation,_true>::shared_ptr
            (&local_88,(shared_ptr<duckdb::FilterRelation> *)local_78);
  if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  pRVar4 = local_50;
  (local_50->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  uVar2 = local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_;
  uVar3 = local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_;
  local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&local_50->_vptr_Relation =
       local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr._0_4_;
  *(undefined4 *)((long)&local_50->_vptr_Relation + 4) =
       local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr._4_4_;
  *(undefined4 *)
   &(local_50->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
    super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar2;
  *(undefined4 *)
   ((long)&(local_50->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
           super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar3;
  local_88.internal.super___shared_ptr<duckdb::FilterRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (local_40.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((ConjunctionExpression *)local_98._M_head_impl != (ConjunctionExpression *)0x0) {
    (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)(local_78 + 0x10));
  sVar6.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pRVar4;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar6.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Filter(const vector<string> &expressions) {
	// if there are multiple expressions, we AND them together
	auto expression_list = StringListToExpressionList(*context->GetContext(), expressions);
	D_ASSERT(!expression_list.empty());

	auto expr = std::move(expression_list[0]);
	for (idx_t i = 1; i < expression_list.size(); i++) {
		expr = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(expr),
		                                        std::move(expression_list[i]));
	}
	return make_shared_ptr<FilterRelation>(shared_from_this(), std::move(expr));
}